

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O3

CharFormat testing::internal::PrintAsCharLiteralTo<wchar_t,wchar_t>(wchar_t c,ostream *os)

{
  undefined4 uVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  char local_19;
  
  switch(c) {
  case L'\0':
    pcVar4 = "\\0";
    break;
  case L'\x01':
  case L'\x02':
  case L'\x03':
  case L'\x04':
  case L'\x05':
  case L'\x06':
switchD_00137301_caseD_1:
    if ((uint)(c + L'\xffffffe0') < 0x5f) {
      local_19 = (char)c;
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_19,1);
      return kAsIs;
    }
    uVar1 = *(undefined4 *)(os + *(long *)(*(long *)os + -0x18) + 0x18);
    std::__ostream_insert<char,std::char_traits<char>>(os,"\\x",2);
    lVar2 = *(long *)os;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(os + lVar3 + 0x18) = *(uint *)(os + lVar3 + 0x18) & 0xffffffb5 | 8;
    *(uint *)(os + *(long *)(lVar2 + -0x18) + 0x18) =
         *(uint *)(os + *(long *)(lVar2 + -0x18) + 0x18) | 0x4000;
    std::ostream::operator<<((ostream *)os,c);
    *(undefined4 *)(os + *(long *)(*(long *)os + -0x18) + 0x18) = uVar1;
    return kHexEscape;
  case L'\a':
    pcVar4 = "\\a";
    break;
  case L'\b':
    pcVar4 = "\\b";
    break;
  case L'\t':
    pcVar4 = "\\t";
    break;
  case L'\n':
    pcVar4 = "\\n";
    break;
  case L'\v':
    pcVar4 = "\\v";
    break;
  case L'\f':
    pcVar4 = "\\f";
    break;
  case L'\r':
    pcVar4 = "\\r";
    break;
  default:
    if (c == L'\'') {
      pcVar4 = "\\\'";
    }
    else {
      if (c != L'\\') goto switchD_00137301_caseD_1;
      pcVar4 = "\\\\";
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar4,2);
  return kSpecialEscape;
}

Assistant:

static CharFormat PrintAsCharLiteralTo(Char c, ostream* os) {
  switch (static_cast<wchar_t>(c)) {
    case L'\0':
      *os << "\\0";
      break;
    case L'\'':
      *os << "\\'";
      break;
    case L'\\':
      *os << "\\\\";
      break;
    case L'\a':
      *os << "\\a";
      break;
    case L'\b':
      *os << "\\b";
      break;
    case L'\f':
      *os << "\\f";
      break;
    case L'\n':
      *os << "\\n";
      break;
    case L'\r':
      *os << "\\r";
      break;
    case L'\t':
      *os << "\\t";
      break;
    case L'\v':
      *os << "\\v";
      break;
    default:
      if (IsPrintableAscii(c)) {
        *os << static_cast<char>(c);
        return kAsIs;
      } else {
        ostream::fmtflags flags = os->flags();
        *os << "\\x" << std::hex << std::uppercase
            << static_cast<int>(static_cast<UnsignedChar>(c));
        os->flags(flags);
        return kHexEscape;
      }
  }
  return kSpecialEscape;
}